

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O2

int rnndec_varaddvalue(rnndeccontext *ctx,char *varset,uint64_t value)

{
  int iVar1;
  rnnenum *prVar2;
  ulong uVar3;
  rnndecvariant *prVar4;
  rnndecvariant **pprVar5;
  int iVar6;
  ulong uVar7;
  
  prVar2 = rnn_findenum(ctx->db,varset);
  if (prVar2 == (rnnenum *)0x0) {
    fprintf(_stderr,"Enum %s doesn\'t exist in database!\n",varset);
  }
  else {
    uVar7 = 0;
    uVar3 = (ulong)(uint)prVar2->valsnum;
    if (prVar2->valsnum < 1) {
      uVar3 = uVar7;
    }
    for (; uVar3 != uVar7; uVar7 = uVar7 + 1) {
      if ((prVar2->vals[uVar7]->valvalid != 0) && (prVar2->vals[uVar7]->value == value)) {
        prVar4 = (rnndecvariant *)calloc(0x10,1);
        prVar4->en = prVar2;
        prVar4->variant = (int)uVar7;
        iVar6 = ctx->varsnum;
        iVar1 = ctx->varsmax;
        if (iVar6 < iVar1) {
          pprVar5 = ctx->vars;
        }
        else {
          iVar6 = 0x10;
          if (iVar1 != 0) {
            iVar6 = iVar1 * 2;
          }
          ctx->varsmax = iVar6;
          pprVar5 = (rnndecvariant **)realloc(ctx->vars,(long)iVar6 << 3);
          ctx->vars = pprVar5;
          iVar6 = ctx->varsnum;
        }
        ctx->varsnum = iVar6 + 1;
        pprVar5[iVar6] = prVar4;
        return 1;
      }
    }
    fprintf(_stderr,"Value %lx doesn\'t exist in enum %s!\n",value,varset);
  }
  return 0;
}

Assistant:

int rnndec_varaddvalue(struct rnndeccontext *ctx, char *varset, uint64_t value)
{
	struct rnnenum *en = rnn_findenum(ctx->db, varset);
	if (!en) {
		fprintf (stderr, "Enum %s doesn't exist in database!\n", varset);
		return 0;
	}
	int i;
	for (i = 0; i < en->valsnum; i++)
		if (en->vals[i]->valvalid && en->vals[i]->value == value) {
			struct rnndecvariant *ci = calloc (sizeof *ci, 1);
			ci->en = en;
			ci->variant = i;
			ADDARRAY(ctx->vars, ci);
			return 1;
		}

	fprintf (stderr, "Value %"PRIx64" doesn't exist in enum %s!\n", value, varset);
	return 0;
}